

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mvref_common.c
# Opt level: O2

void process_compound_ref_mv_candidate
               (MB_MODE_INFO *candidate,AV1_COMMON *cm,MV_REFERENCE_FRAME *rf,int_mv (*ref_id) [2],
               int *ref_id_count,int_mv (*ref_diff) [2],int *ref_diff_count)

{
  byte bVar1;
  byte *pbVar2;
  int rf_idx;
  long lVar3;
  int *piVar4;
  long lVar5;
  int cmp_idx;
  long lVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  
  lVar3 = 0;
  do {
    if (lVar3 == 2) {
      return;
    }
    bVar1 = candidate->ref_frame[lVar3];
    lVar6 = 0;
    pbVar2 = (byte *)rf;
    for (lVar5 = 0; lVar5 != 8; lVar5 = lVar5 + 4) {
      if ((bVar1 == *pbVar2) && ((long)*(int *)((long)ref_id_count + lVar5) < 2)) {
        piVar4 = ref_id_count + lVar6;
        *(int_mv *)((long)*ref_id + lVar5 * 2 + (long)*(int *)((long)ref_id_count + lVar5) * 4) =
             candidate->mv[lVar3];
LAB_00330aae:
        *piVar4 = *piVar4 + 1;
      }
      else if (('\0' < (char)bVar1) && ((long)*(int *)((long)ref_diff_count + lVar5) < 2)) {
        piVar4 = (int *)((long)ref_diff_count + lVar5);
        auVar7 = ZEXT116(cm->ref_frame_sign_bias[bVar1] == cm->ref_frame_sign_bias[(char)*pbVar2]);
        auVar7 = pshuflw(auVar7,auVar7,0);
        auVar7 = psllw(auVar7,0xf);
        auVar8 = psraw(auVar7,0xf);
        auVar7 = ZEXT416(candidate->mv[lVar3].as_int) ^ auVar8;
        *(uint *)((long)*ref_diff + lVar5 * 2 + (long)*(int *)((long)ref_diff_count + lVar5) * 4) =
             CONCAT22(auVar8._2_2_ - auVar7._2_2_,auVar8._0_2_ - auVar7._0_2_);
        goto LAB_00330aae;
      }
      lVar6 = lVar6 + 1;
      pbVar2 = pbVar2 + 1;
    }
    lVar3 = lVar3 + 1;
  } while( true );
}

Assistant:

static inline void process_compound_ref_mv_candidate(
    const MB_MODE_INFO *const candidate, const AV1_COMMON *const cm,
    const MV_REFERENCE_FRAME *const rf, int_mv ref_id[2][2],
    int ref_id_count[2], int_mv ref_diff[2][2], int ref_diff_count[2]) {
  for (int rf_idx = 0; rf_idx < 2; ++rf_idx) {
    MV_REFERENCE_FRAME can_rf = candidate->ref_frame[rf_idx];

    for (int cmp_idx = 0; cmp_idx < 2; ++cmp_idx) {
      if (can_rf == rf[cmp_idx] && ref_id_count[cmp_idx] < 2) {
        ref_id[cmp_idx][ref_id_count[cmp_idx]] = candidate->mv[rf_idx];
        ++ref_id_count[cmp_idx];
      } else if (can_rf > INTRA_FRAME && ref_diff_count[cmp_idx] < 2) {
        int_mv this_mv = candidate->mv[rf_idx];
        if (cm->ref_frame_sign_bias[can_rf] !=
            cm->ref_frame_sign_bias[rf[cmp_idx]]) {
          this_mv.as_mv.row = -this_mv.as_mv.row;
          this_mv.as_mv.col = -this_mv.as_mv.col;
        }
        ref_diff[cmp_idx][ref_diff_count[cmp_idx]] = this_mv;
        ++ref_diff_count[cmp_idx];
      }
    }
  }
}